

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_appender<char>
fmt::v11::detail::write_exponent<char,fmt::v11::basic_appender<char>>
          (int exp,basic_appender<char> out)

{
  uint uVar1;
  ulong uVar2;
  basic_appender<char> local_30;
  
  uVar2 = (ulong)(uint)exp;
  local_30.container = out.container;
  if (exp < 0) {
    basic_appender<char>::operator=(&local_30,'-');
    uVar2 = (ulong)(uint)-exp;
  }
  else {
    basic_appender<char>::operator=(&local_30,'+');
  }
  uVar1 = (uint)uVar2;
  if (99 < uVar1) {
    if (999 < uVar1) {
      local_30.container = out.container;
      basic_appender<char>::operator=(&local_30,digits2(unsigned_long)::data[(uVar2 / 100) * 2]);
    }
    local_30.container = out.container;
    basic_appender<char>::operator=(&local_30,digits2(unsigned_long)::data[(uVar2 / 100) * 2 + 1]);
    uVar1 = (uint)(uVar2 % 100);
  }
  local_30.container = out.container;
  basic_appender<char>::operator=(&local_30,digits2(unsigned_long)::data[(ulong)uVar1 * 2]);
  local_30.container = out.container;
  basic_appender<char>::operator=(&local_30,digits2(unsigned_long)::data[(ulong)uVar1 * 2 + 1]);
  return (basic_appender<char>)out.container;
}

Assistant:

FMT_CONSTEXPR auto write_exponent(int exp, OutputIt out) -> OutputIt {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *out++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *out++ = static_cast<Char>('+');
  }
  auto uexp = static_cast<uint32_t>(exp);
  if (is_constant_evaluated()) {
    if (uexp < 10) *out++ = '0';
    return format_decimal<Char>(out, uexp, count_digits(uexp));
  }
  if (uexp >= 100u) {
    const char* top = digits2(uexp / 100);
    if (uexp >= 1000u) *out++ = static_cast<Char>(top[0]);
    *out++ = static_cast<Char>(top[1]);
    uexp %= 100;
  }
  const char* d = digits2(uexp);
  *out++ = static_cast<Char>(d[0]);
  *out++ = static_cast<Char>(d[1]);
  return out;
}